

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

bool __thiscall cmGlobalNinjaGenerator::CheckISPC(cmGlobalNinjaGenerator *this,cmMakefile *mf)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  ostream *poVar3;
  ostringstream e;
  string local_1b8;
  undefined1 local_198 [376];
  
  bVar2 = this->NinjaSupportsMultipleOutputs;
  if (bVar2 == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,
               "The Ninja generator does not support ISPC using Ninja version\n  ",0x40);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,(this->NinjaVersion)._M_dataplus._M_p,
                        (this->NinjaVersion)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"\ndue to lack of required features.  Ninja ",0x2a);
    paVar1 = &local_1b8.field_2;
    local_1b8.field_2._M_allocated_capacity._0_4_ = 0x30312e31;
    local_1b8._M_string_length = 4;
    local_1b8.field_2._M_allocated_capacity._4_4_ =
         local_1b8.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
    local_1b8._M_dataplus._M_p = (pointer)paVar1;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,paVar1->_M_local_buf,4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," or higher is required.",0x17);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b8._M_dataplus._M_p,
                      CONCAT44(local_1b8.field_2._M_allocated_capacity._4_4_,
                               local_1b8.field_2._M_allocated_capacity._0_4_) + 1);
    }
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b8._M_dataplus._M_p,
                      CONCAT44(local_1b8.field_2._M_allocated_capacity._4_4_,
                               local_1b8.field_2._M_allocated_capacity._0_4_) + 1);
    }
    cmSystemTools::s_FatalErrorOccurred = true;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  }
  return bVar2;
}

Assistant:

bool cmGlobalNinjaGenerator::CheckISPC(cmMakefile* mf) const
{
  if (this->NinjaSupportsMultipleOutputs) {
    return true;
  }

  std::ostringstream e;
  /* clang-format off */
  e <<
    "The Ninja generator does not support ISPC using Ninja version\n"
    "  " << this->NinjaVersion << "\n"
    "due to lack of required features.  "
    "Ninja " << RequiredNinjaVersionForMultipleOutputs() <<
    " or higher is required."
    ;
  /* clang-format on */
  mf->IssueMessage(MessageType::FATAL_ERROR, e.str());
  cmSystemTools::SetFatalErrorOccurred();
  return false;
}